

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hbox.cpp
# Opt level: O1

void __thiscall ftxui::HBox::SetBox(HBox *this,Box box)

{
  int iVar1;
  pointer puVar2;
  Node *pNVar3;
  int iVar4;
  unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *child;
  pointer puVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_> *child_1;
  pointer puVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  
  uVar8 = box._0_8_;
  Node::SetBox(&this->super_Node,box);
  puVar2 = (this->super_Node).children.
           super__Vector_base<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar7 = 0;
  puVar9 = (this->super_Node).children.
           super__Vector_base<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>,_std::allocator<std::unique_ptr<ftxui::Node,_std::default_delete<ftxui::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar5 = puVar9; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    iVar7 = iVar7 + (((puVar5->_M_t).
                      super___uniq_ptr_impl<ftxui::Node,_std::default_delete<ftxui::Node>_>._M_t.
                      super__Tuple_impl<0UL,_ftxui::Node_*,_std::default_delete<ftxui::Node>_>.
                      super__Head_base<0UL,_ftxui::Node_*,_false>._M_head_impl)->requirement_).flex.
                    x;
  }
  if (puVar9 != puVar2) {
    uVar10 = uVar8 >> 0x20;
    iVar6 = (box.x_max - ((this->super_Node).requirement_.min.x + box.x_min)) + 1;
    do {
      pNVar3 = (puVar9->_M_t).super___uniq_ptr_impl<ftxui::Node,_std::default_delete<ftxui::Node>_>.
               _M_t.super__Tuple_impl<0UL,_ftxui::Node_*,_std::default_delete<ftxui::Node>_>.
               super__Head_base<0UL,_ftxui::Node_*,_false>._M_head_impl;
      iVar1 = (pNVar3->requirement_).flex.x;
      uVar11 = ((int)uVar8 + (pNVar3->requirement_).min.x) - 1;
      if ((iVar1 != 0) && (0 < iVar6)) {
        iVar4 = (iVar1 * iVar6) / iVar7;
        iVar6 = iVar6 - iVar4;
        iVar7 = iVar7 - iVar1;
        uVar11 = uVar11 + iVar4;
      }
      uVar12 = (ulong)uVar11;
      if (box.x_max <= (int)uVar11) {
        uVar12 = uVar10;
      }
      (*pNVar3->_vptr_Node[3])(pNVar3,uVar8 & 0xffffffff | uVar12 << 0x20,box._8_8_);
      puVar9 = puVar9 + 1;
      uVar8 = (ulong)((int)uVar12 + 1);
    } while (puVar9 != puVar2);
  }
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    int flex_sum = 0;
    for (auto& child : children)
      flex_sum += child->requirement().flex.x;

    int space = box.x_max - box.x_min + 1;
    int extra_space = space - requirement_.min.x;

    int remaining_flex = flex_sum;
    int remaining_extra_space = extra_space;

    int x = box.x_min;
    for (auto& child : children) {
      Box child_box = box;
      child_box.x_min = x;

      child_box.x_max = x + child->requirement().min.x - 1;

      if (child->requirement().flex.x && remaining_extra_space > 0) {
        int added_space = remaining_extra_space * child->requirement().flex.x /
                          remaining_flex;
        remaining_extra_space -= added_space;
        remaining_flex -= child->requirement().flex.x;
        child_box.x_max += added_space;
      }
      child_box.x_max = std::min(child_box.x_max, box.x_max);

      child->SetBox(child_box);
      x = child_box.x_max + 1;
    }
  }